

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O3

uint16_t __thiscall create::Create::getLightSignalRight(Create *this)

{
  bool bVar1;
  uint16_t uVar2;
  Packet *local_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  bVar1 = Data::isValidPacketID
                    ((this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,'3');
  if (bVar1) {
    Data::getPacket((Data *)&local_18,
                    (uint8_t)(this->data).
                             super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    uVar2 = Packet::getData(local_18);
    if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[create::Create] ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Light sensors not supported!",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

uint16_t Create::getLightSignalRight() const {
    if (data->isValidPacketID(ID_LIGHT_RIGHT)) {
      return GET_DATA(ID_LIGHT_RIGHT);
    }
    else {
      CERR("[create::Create] ", "Light sensors not supported!");
      return 0;
    }
  }